

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<unsigned_long>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<unsigned_long> *out)

{
  int iVar1;
  pointer puVar2;
  LogMessage *pLVar3;
  uint uVar4;
  char *pcVar5;
  int n;
  RepeatedField<unsigned_long> *local_50;
  int local_44;
  LogMessage local_40 [16];
  
  if (ptr == (char *)0x0) {
LAB_0029b7f9:
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = this->buffer_end_ + (0x10 - (long)ptr);
    local_50 = out;
    if ((int)pcVar5 < size) {
      do {
        uVar4 = (uint)pcVar5;
        iVar1 = SooRep::size(&out->soo_rep_,
                             (undefined1  [16])
                             ((undefined1  [16])(out->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
        RepeatedField<unsigned_long>::Reserve(out,iVar1 + ((int)uVar4 >> 3));
        puVar2 = RepeatedField<unsigned_long>::AddNAlreadyReserved(out,(int)uVar4 >> 3);
        memcpy(puVar2,ptr,(long)(int)(uVar4 & 0xfffffff8));
        if ((this->limit_ < 0x11) || (pcVar5 = Next(this), pcVar5 == (char *)0x0))
        goto LAB_0029b7f9;
        size = size - (uVar4 & 0xfffffff8);
        ptr = pcVar5 + (0x10 - (ulong)(uVar4 & 7));
        pcVar5 = this->buffer_end_ + (0x10 - (long)ptr);
      } while ((int)pcVar5 < size);
    }
    uVar4 = size & 0xfffffff8;
    if (7 < (uint)size) {
      n = size >> 3;
      iVar1 = SooRep::size(&out->soo_rep_,
                           (undefined1  [16])
                           ((undefined1  [16])(out->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                           (undefined1  [16])0x0);
      RepeatedField<unsigned_long>::Reserve(out,iVar1 + n);
      puVar2 = RepeatedField<unsigned_long>::AddNAlreadyReserved(out,n);
      if (puVar2 == (pointer)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x4a6,0xe,"dst != nullptr");
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::
                 operator<<<google::protobuf::RepeatedField<unsigned_long>_*,_0>(local_40,&local_50)
        ;
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (pLVar3,1,",");
        local_44 = n;
        _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                  (pLVar3);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_40);
      }
      memcpy(puVar2,ptr,(long)(int)uVar4);
      ptr = ptr + (int)uVar4;
    }
    pcVar5 = (char *)0x0;
    if (size == uVar4) {
      pcVar5 = ptr;
    }
  }
  return pcVar5;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  }
  int num = size / sizeof(T);
  int block_size = num * sizeof(T);
  if (num == 0) return size == block_size ? ptr : nullptr;
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
  ABSL_CHECK(dst != nullptr) << out << "," << num;
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}